

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

double __thiscall libtorrent::aux::session_impl::log(session_impl *this,double __x)

{
  char in_AL;
  double extraout_XMM0_Qa;
  va_list v;
  char *local_e8;
  dht_module_t local_dc;
  __va_list_tag local_d8;
  undefined1 local_b8 [48];
  double local_88;
  
  if (in_AL != '\0') {
    local_88 = __x;
  }
  if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0x11 & 1) != 0) {
    local_d8.reg_save_area = local_b8;
    local_d8.overflow_arg_area = &stack0x00000008;
    local_d8.gp_offset = 0x18;
    local_d8.fp_offset = 0x30;
    alert_manager::
    emplace_alert<libtorrent::dht_log_alert,libtorrent::dht_log_alert::dht_module_t,char_const*&,__va_list_tag(&)[1]>
              (&this->m_alerts,&local_dc,&local_e8,(__va_list_tag (*) [1])&local_d8);
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

void session_impl::log(module_t m, char const* fmt, ...)
	{
		if (!m_alerts.should_post<dht_log_alert>()) return;

		va_list v;
		va_start(v, fmt);
		m_alerts.emplace_alert<dht_log_alert>(
			static_cast<dht_log_alert::dht_module_t>(m), fmt, v);
		va_end(v);
	}